

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O2

void __thiscall soul::Module::Module(Module *this,Program *p,Module *toClone)

{
  (this->program).pimpl = p->pimpl;
  (this->program).refHolder.object = (ProgramImpl *)0x0;
  std::__cxx11::string::string((string *)&this->shortName,(string *)&toClone->shortName);
  std::__cxx11::string::string((string *)&this->fullName,(string *)&toClone->fullName);
  std::__cxx11::string::string
            ((string *)&this->originalFullName,(string *)&toClone->originalFullName);
  (this->processorInstances).
  super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processorInstances).
  super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->connections).
  super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->processorInstances).
  super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputs).
  super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputs).
  super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inputs).
  super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outputs).
  super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputs).
  super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputs).
  super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Annotation::Annotation(&this->annotation,&toClone->annotation);
  this->sampleRate = 0.0;
  this->latency = 0;
  (this->location).sourceCode.object = (SourceCodeText *)0x0;
  (this->location).location.data = (char *)0x0;
  this->moduleUseTestFlag = false;
  this->allocator = &p->pimpl->allocator;
  (this->functions).functions.items =
       (pool_ref<soul::heart::Function> *)(this->functions).functions.space;
  (this->functions).functions.numActive = 0;
  (this->functions).functions.numAllocated = 0x20;
  (this->functions).module = this;
  (this->stateVariables).stateVariables.items =
       (pool_ref<soul::heart::Variable> *)(this->stateVariables).stateVariables.space;
  (this->stateVariables).stateVariables.numActive = 0;
  (this->stateVariables).stateVariables.numAllocated = 0x20;
  (this->structs).structs.items = (RefCountedPtr<soul::Structure> *)(this->structs).structs.space;
  (this->structs).structs.numActive = 0;
  (this->structs).structs.numAllocated = 0x20;
  this->moduleID = 0;
  this->moduleType = toClone->moduleType;
  return;
}

Assistant:

Module::Module (Program& p, const Module& toClone)
   : program (*p.pimpl, false),
     shortName (toClone.shortName),
     fullName (toClone.fullName),
     originalFullName (toClone.originalFullName),
     annotation (toClone.annotation),
     allocator (p.getAllocator()),
     functions (*this),
     moduleType (toClone.moduleType)
{
}